

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_udev.cc
# Opt level: O0

void __thiscall ccel::udev::virtual_keyboard_handler::sync(virtual_keyboard_handler *this)

{
  ssize_t sVar1;
  runtime_error *this_00;
  void *in_RSI;
  
  *(undefined2 *)((long)in_RSI + 0x10) = 0;
  *(undefined2 *)((long)in_RSI + 0x12) = 0;
  *(undefined4 *)((long)in_RSI + 0x14) = 0;
  sVar1 = write(this->_fd,in_RSI,0x18);
  if (sVar1 < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Error while syncing keypress with kernel events.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void virtual_keyboard_handler::sync(input_event &__ev) {
  // uinput events needs to sync or it would stacked
  __ev.type = EV_SYN;
  __ev.code = SYN_REPORT;
  __ev.value = 0;
  if (write(_fd, &__ev, sizeof(input_event)) <
      0) // In fact,if error happened, only -1 would be returned
    throw std::runtime_error(
        "Error while syncing keypress with kernel events.");
}